

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ItemSimilarityRecommender_ConnectedItem::
ItemSimilarityRecommender_ConnectedItem
          (ItemSimilarityRecommender_ConnectedItem *this,
          ItemSimilarityRecommender_ConnectedItem *from)

{
  void *pvVar1;
  double dVar2;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__ItemSimilarityRecommender_ConnectedItem_00770f28;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  dVar2 = from->similarityscore_;
  this->itemid_ = from->itemid_;
  this->similarityscore_ = dVar2;
  return;
}

Assistant:

ItemSimilarityRecommender_ConnectedItem::ItemSimilarityRecommender_ConnectedItem(const ItemSimilarityRecommender_ConnectedItem& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&itemid_, &from.itemid_,
    reinterpret_cast<char*>(&similarityscore_) -
    reinterpret_cast<char*>(&itemid_) + sizeof(similarityscore_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ItemSimilarityRecommender.ConnectedItem)
}